

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Rendering.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Rendering_IndexedTriangleSet(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pFVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar6;
  size_type sVar7;
  DeadlyImportError *this_00;
  CX3DImporter_NodeElement_IndexedSet *this_01;
  reference piVar8;
  long lVar9;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  byte local_11d;
  value_type_conflict4 local_11c;
  bool close_found;
  iterator iStack_118;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_110;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_108;
  const_iterator idx_it;
  int32_t idx_1 [3];
  int counter;
  CX3DImporter_NodeElement_IndexedSet *ne_alias;
  string local_e0;
  undefined4 local_c0;
  allocator<char> local_b9;
  undefined1 local_b8 [8];
  string an;
  uint local_84;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  undefined1 local_70 [6];
  bool solid;
  bool normalPerVertex;
  vector<int,_std::allocator<int>_> index;
  string local_50 [6];
  bool colorPerVertex;
  bool ccw;
  string def;
  string use;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(def.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_50);
  index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._6_1_ = 1;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_70);
  ne._7_1_ = 1;
  ne._6_1_ = 1;
  _idx_end = (CX3DImporter_NodeElement_IndexedSet *)0x0;
  local_84 = 0;
  pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_84 < iVar2; local_84 = local_84 + 1) {
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar5,(ulong)local_84);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b8,(char *)CONCAT44(extraout_var,iVar3),&local_b9);
    std::allocator<char>::~allocator(&local_b9);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b8,"DEF");
    if (bVar1) {
      pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar5,(ulong)local_84);
      std::__cxx11::string::operator=(local_50,(char *)CONCAT44(extraout_var_00,iVar3));
      local_c0 = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b8,"USE");
      if (bVar1) {
        pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar5,(ulong)local_84);
        std::__cxx11::string::operator=
                  ((string *)(def.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_01,iVar3))
        ;
        local_c0 = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_b8,"bboxCenter");
        if (bVar1) {
          local_c0 = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_b8,"bboxSize");
          if (bVar1) {
            local_c0 = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_b8,"containerField");
            if (bVar1) {
              local_c0 = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_b8,"ccw");
              if (bVar1) {
                index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage._7_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_84);
                local_c0 = 4;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_b8,"colorPerVertex");
                if (bVar1) {
                  index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._6_1_ =
                       XML_ReadNode_GetAttrVal_AsBool(this,local_84);
                  local_c0 = 4;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_b8,"index");
                  if (bVar1) {
                    XML_ReadNode_GetAttrVal_AsArrI32
                              (this,local_84,(vector<int,_std::allocator<int>_> *)local_70);
                    local_c0 = 4;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_b8,"normalPerVertex");
                    if (bVar1) {
                      ne._7_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_84);
                      local_c0 = 4;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_b8,"solid");
                      if (bVar1) {
                        ne._6_1_ = XML_ReadNode_GetAttrVal_AsBool(this,local_84);
                        local_c0 = 4;
                      }
                      else {
                        Throw_IncorrectAttr(this,(string *)local_b8);
                        local_c0 = 0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_b8);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)((long)&def.field_2 + 8),ENET_IndexedTriangleSet,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)((long)&def.field_2 + 8));
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    sVar7 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)local_70);
    if (sVar7 == 0) {
      ne_alias._6_1_ = 1;
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,
                 "IndexedTriangleSet must contain not empty \"index\" attribute.",
                 (allocator<char> *)((long)&ne_alias + 7));
      DeadlyImportError::DeadlyImportError(this_00,&local_e0);
      ne_alias._6_1_ = 0;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    this_01 = (CX3DImporter_NodeElement_IndexedSet *)operator_new(0xf0);
    CX3DImporter_NodeElement_IndexedSet::CX3DImporter_NodeElement_IndexedSet
              (this_01,ENET_IndexedTriangleSet,this->NodeElement_Cur);
    _idx_end = this_01;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)
                 &(_idx_end->super_CX3DImporter_NodeElement_Geometry3D).
                  super_CX3DImporter_NodeElement.ID,local_50);
    }
    stack0xffffffffffffff10 = _idx_end;
    (_idx_end->super_CX3DImporter_NodeElement_Geometry3D).field_0x71 =
         index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._7_1_ & 1;
    _idx_end->ColorPerVertex =
         (bool)(index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage._6_1_ & 1);
    _idx_end->NormalPerVertex = (bool)(ne._7_1_ & 1);
    (_idx_end->super_CX3DImporter_NodeElement_Geometry3D).Solid = (bool)(ne._6_1_ & 1);
    std::vector<int,_std::allocator<int>_>::clear(&_idx_end->CoordIndex);
    idx_1[1] = 0;
    local_110._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)local_70);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_108,
               &local_110);
    while( true ) {
      iStack_118 = std::vector<int,_std::allocator<int>_>::end
                             ((vector<int,_std::allocator<int>_> *)local_70);
      bVar1 = __gnu_cxx::operator!=(&local_108,&stack0xfffffffffffffee8);
      if (!bVar1) break;
      piVar8 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_108);
      lVar9 = (long)idx_1[1];
      idx_1[1] = idx_1[1] + 1;
      idx_1[lVar9 + -2] = *piVar8;
      if (2 < idx_1[1]) {
        idx_1[1] = 0;
        if ((index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._7_1_ & 1) == 0) {
          std::vector<int,_std::allocator<int>_>::push_back
                    (&stack0xffffffffffffff10->CoordIndex,(value_type_conflict4 *)&idx_it);
          std::vector<int,_std::allocator<int>_>::push_back
                    (&stack0xffffffffffffff10->CoordIndex,idx_1);
          std::vector<int,_std::allocator<int>_>::push_back
                    (&stack0xffffffffffffff10->CoordIndex,
                     (value_type_conflict4 *)((long)&idx_it._M_current + 4));
        }
        else {
          std::vector<int,_std::allocator<int>_>::push_back
                    (&stack0xffffffffffffff10->CoordIndex,(value_type_conflict4 *)&idx_it);
          std::vector<int,_std::allocator<int>_>::push_back
                    (&stack0xffffffffffffff10->CoordIndex,
                     (value_type_conflict4 *)((long)&idx_it._M_current + 4));
          std::vector<int,_std::allocator<int>_>::push_back
                    (&stack0xffffffffffffff10->CoordIndex,idx_1);
        }
        local_11c = -1;
        std::vector<int,_std::allocator<int>_>::push_back
                  (&stack0xffffffffffffff10->CoordIndex,&local_11c);
      }
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_108);
    }
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    if ((uVar4 & 1) == 0) {
      ParseHelper_Node_Enter(this,(CX3DImporter_NodeElement *)_idx_end);
      local_11d = 0;
      do {
        do {
          while( true ) {
            pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                     operator->(&this->mReader);
            uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])
                              ();
            if ((uVar4 & 1) == 0) goto LAB_00a220fd;
            pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                     operator->(&this->mReader);
            iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])
                              ();
            if (iVar2 != 1) break;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_140,"Color",&local_141);
            bVar1 = XML_CheckNode_NameEqual(this,&local_140);
            std::__cxx11::string::~string((string *)&local_140);
            std::allocator<char>::~allocator(&local_141);
            if (bVar1) {
              ParseNode_Rendering_Color(this);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_168,"ColorRGBA",&local_169);
              bVar1 = XML_CheckNode_NameEqual(this,&local_168);
              std::__cxx11::string::~string((string *)&local_168);
              std::allocator<char>::~allocator(&local_169);
              if (bVar1) {
                ParseNode_Rendering_ColorRGBA(this);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_190,"Coordinate",&local_191);
                bVar1 = XML_CheckNode_NameEqual(this,&local_190);
                std::__cxx11::string::~string((string *)&local_190);
                std::allocator<char>::~allocator(&local_191);
                if (bVar1) {
                  ParseNode_Rendering_Coordinate(this);
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1b8,"Normal",&local_1b9);
                  bVar1 = XML_CheckNode_NameEqual(this,&local_1b8);
                  std::__cxx11::string::~string((string *)&local_1b8);
                  std::allocator<char>::~allocator(&local_1b9);
                  if (bVar1) {
                    ParseNode_Rendering_Normal(this);
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1e0,"TextureCoordinate",&local_1e1);
                    bVar1 = XML_CheckNode_NameEqual(this,&local_1e0);
                    std::__cxx11::string::~string((string *)&local_1e0);
                    std::allocator<char>::~allocator(&local_1e1);
                    if (bVar1) {
                      ParseNode_Texturing_TextureCoordinate(this);
                    }
                    else {
                      bVar1 = ParseHelper_CheckRead_X3DMetadataObject(this);
                      if (!bVar1) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_208,"IndexedTriangleSet",&local_209);
                        XML_CheckNode_SkipUnsupported(this,&local_208);
                        std::__cxx11::string::~string((string *)&local_208);
                        std::allocator<char>::~allocator(&local_209);
                      }
                    }
                  }
                }
              }
            }
          }
          pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                   operator->(&this->mReader);
          iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])()
          ;
        } while (iVar2 != 2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_230,"IndexedTriangleSet",&local_231);
        bVar1 = XML_CheckNode_NameEqual(this,&local_230);
        std::__cxx11::string::~string((string *)&local_230);
        std::allocator<char>::~allocator(&local_231);
      } while (!bVar1);
      local_11d = 1;
LAB_00a220fd:
      if ((local_11d & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_258,"IndexedTriangleSet",&local_259);
        Throw_CloseNotFound(this,&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        std::allocator<char>::~allocator(&local_259);
      }
      ParseHelper_Node_Exit(this);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_70);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_Rendering_IndexedTriangleSet()
{
    std::string use, def;
    bool ccw = true;
    bool colorPerVertex = true;
    std::vector<int32_t> index;
    bool normalPerVertex = true;
    bool solid = true;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("ccw", ccw, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("colorPerVertex", colorPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_REF("index", index, XML_ReadNode_GetAttrVal_AsArrI32);
		MACRO_ATTRREAD_CHECK_RET("normalPerVertex", normalPerVertex, XML_ReadNode_GetAttrVal_AsBool);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_IndexedTriangleSet, ne);
	}
	else
	{
		// check data
		if(index.size() == 0) throw DeadlyImportError("IndexedTriangleSet must contain not empty \"index\" attribute.");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_IndexedSet(CX3DImporter_NodeElement::ENET_IndexedTriangleSet, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		CX3DImporter_NodeElement_IndexedSet& ne_alias = *((CX3DImporter_NodeElement_IndexedSet*)ne);

		ne_alias.CCW = ccw;
		ne_alias.ColorPerVertex = colorPerVertex;
		ne_alias.NormalPerVertex = normalPerVertex;
		ne_alias.Solid = solid;

		ne_alias.CoordIndex.clear();
		int counter = 0;
		int32_t idx[3];
		for(std::vector<int32_t>::const_iterator idx_it = index.begin(); idx_it != index.end(); ++idx_it)
		{
			idx[counter++] = *idx_it;
			if (counter > 2)
			{
				counter = 0;
				if(ccw)
				{
					ne_alias.CoordIndex.push_back(idx[0]);
					ne_alias.CoordIndex.push_back(idx[1]);
					ne_alias.CoordIndex.push_back(idx[2]);
				}
				else
				{
					ne_alias.CoordIndex.push_back(idx[0]);
					ne_alias.CoordIndex.push_back(idx[2]);
					ne_alias.CoordIndex.push_back(idx[1]);
				}
				ne_alias.CoordIndex.push_back(-1);
			}
		}// for(std::list<int32_t>::const_iterator idx_it = index.begin(); idx_it != ne_alias.index.end(); idx_it++)

        // check for child nodes
        if(!mReader->isEmptyElement())
        {
			ParseHelper_Node_Enter(ne);
			MACRO_NODECHECK_LOOPBEGIN("IndexedTriangleSet");
				// check for X3DComposedGeometryNodes
				if(XML_CheckNode_NameEqual("Color")) { ParseNode_Rendering_Color(); continue; }
				if(XML_CheckNode_NameEqual("ColorRGBA")) { ParseNode_Rendering_ColorRGBA(); continue; }
				if(XML_CheckNode_NameEqual("Coordinate")) { ParseNode_Rendering_Coordinate(); continue; }
				if(XML_CheckNode_NameEqual("Normal")) { ParseNode_Rendering_Normal(); continue; }
				if(XML_CheckNode_NameEqual("TextureCoordinate")) { ParseNode_Texturing_TextureCoordinate(); continue; }
				// check for X3DMetadataObject
				if(!ParseHelper_CheckRead_X3DMetadataObject()) XML_CheckNode_SkipUnsupported("IndexedTriangleSet");

			MACRO_NODECHECK_LOOPEND("IndexedTriangleSet");
			ParseHelper_Node_Exit();
		}// if(!mReader->isEmptyElement())
		else
		{
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element
		}

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}